

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_allocator.hpp
# Opt level: O2

void __thiscall
Al::internal::
CachingAllocator<(Al::internal::MemoryType)0,_Al::internal::HostMemoryAllocator,_Al::internal::CachingAllocatorDefaultParams>
::clear(CachingAllocator<(Al::internal::MemoryType)0,_Al::internal::HostMemoryAllocator,_Al::internal::CachingAllocatorDefaultParams>
        *this)

{
  pointer pvVar1;
  pointer ppvVar2;
  void **ptr;
  pointer ppvVar3;
  size_t bin;
  long lVar4;
  
  std::mutex::lock(&this->mutex);
  for (lVar4 = 0; lVar4 != 0x3d; lVar4 = lVar4 + 1) {
    pvVar1 = (this->free_data).
             super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppvVar2 = *(pointer *)
               ((long)&pvVar1[lVar4].super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl + 8
               );
    for (ppvVar3 = *(pointer *)
                    &pvVar1[lVar4].super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl;
        ppvVar3 != ppvVar2; ppvVar3 = ppvVar3 + 1) {
      free(*ppvVar3);
    }
    pvVar1 = (this->free_data).
             super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppvVar3 = *(pointer *)&pvVar1[lVar4].super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
    ;
    if (*(pointer *)
         ((long)&pvVar1[lVar4].super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl + 8) !=
        ppvVar3) {
      *(pointer *)
       ((long)&pvVar1[lVar4].super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl + 8) =
           ppvVar3;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void clear() {
    std::lock_guard<std::mutex> lg(mutex);
    for (size_t bin = 0; bin < bin_sizes.size(); ++bin) {
      for (auto&& ptr : free_data[bin]) {
        allocator.deallocate(ptr);
      }
      free_data[bin].clear();
    }
  }